

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_profile.c
# Opt level: O0

void luaJIT_profile_start(lua_State *L,char *mode,luaJIT_profile_callback cb,void *data)

{
  bool bVar1;
  int iVar2;
  luaJIT_profile_callback p_Var3;
  int local_44;
  int m;
  int interval;
  ProfileState *ps;
  void *data_local;
  luaJIT_profile_callback cb_local;
  char *mode_local;
  lua_State *L_local;
  
  local_44 = 10;
  cb_local = (luaJIT_profile_callback)mode;
  do {
    while( true ) {
      if (*cb_local == (_func_void_void_ptr_lua_State_ptr_int_int)0x0) {
        if ((profile_state.g == (global_State *)0x0) ||
           (luaJIT_profile_stop(L), profile_state.g == (global_State *)0x0)) {
          profile_state.g = (global_State *)(L->glref).ptr64;
          profile_state.interval = local_44;
          profile_state.samples = 0;
          profile_state.sb.b = (char *)0x0;
          profile_state.sb.e = (char *)0x0;
          profile_state.sb.w = (char *)0x0;
          profile_state.cb = cb;
          profile_state.data = data;
          profile_state.sb.L.ptr64 = (uint64_t)L;
          profile_timer_start(&profile_state);
        }
        return;
      }
      p_Var3 = cb_local + 1;
      iVar2 = (int)(char)*cb_local;
      cb_local = p_Var3;
      if (iVar2 == 0x66) break;
      if (iVar2 == 0x69) {
        local_44 = 0;
        while( true ) {
          bVar1 = false;
          if ('/' < (char)*cb_local) {
            bVar1 = (char)*cb_local < ':';
          }
          if (!bVar1) break;
          local_44 = local_44 * 10 + (char)*cb_local + -0x30;
          cb_local = cb_local + 1;
        }
        if (local_44 < 1) {
          local_44 = 1;
        }
      }
      else if (iVar2 == 0x6c) break;
    }
    *(int *)((L->glref).ptr64 + 0xefc) = iVar2;
    lj_trace_flushall(L);
  } while( true );
}

Assistant:

LUA_API void luaJIT_profile_start(lua_State *L, const char *mode,
				  luaJIT_profile_callback cb, void *data)
{
  ProfileState *ps = &profile_state;
  int interval = LJ_PROFILE_INTERVAL_DEFAULT;
  while (*mode) {
    int m = *mode++;
    switch (m) {
    case 'i':
      interval = 0;
      while (*mode >= '0' && *mode <= '9')
	interval = interval * 10 + (*mode++ - '0');
      if (interval <= 0) interval = 1;
      break;
#if LJ_HASJIT
    case 'l': case 'f':
      L2J(L)->prof_mode = m;
      lj_trace_flushall(L);
      break;
#endif
    default:  /* Ignore unknown mode chars. */
      break;
    }
  }
  if (ps->g) {
    luaJIT_profile_stop(L);
    if (ps->g) return;  /* Profiler in use by another VM. */
  }
  ps->g = G(L);
  ps->interval = interval;
  ps->cb = cb;
  ps->data = data;
  ps->samples = 0;
  lj_buf_init(L, &ps->sb);
  profile_timer_start(ps);
}